

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reporter.cc
# Opt level: O2

void __thiscall
benchmark::CSVReporter::ReportRuns
          (CSVReporter *this,
          vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          *reports)

{
  pointer pRVar1;
  Run *run;
  pointer run_00;
  
  pRVar1 = (reports->
           super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (run_00 = (reports->
                super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                )._M_impl.super__Vector_impl_data._M_start; run_00 != pRVar1; run_00 = run_00 + 1) {
    PrintRunData(this,run_00);
  }
  return;
}

Assistant:

void CSVReporter::ReportRuns(const std::vector<Run> & reports) {
  for (const auto& run : reports)
    PrintRunData(run);
}